

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Event.h
# Opt level: O2

void __thiscall ValueEvent::ValueEvent(ValueEvent *this,double n_value)

{
  Clock *this_00;
  double dVar1;
  
  (this->super_Event)._vptr_Event = (_func_int **)&PTR_setWeight_00130bc8;
  this->value = 0.0;
  (this->super_Event).type = Value;
  this_00 = Clock::getInstance();
  dVar1 = Clock::getCurrentTime(this_00);
  (this->super_Event).eventTime = dVar1;
  this->value = n_value;
  return;
}

Assistant:

ValueEvent(double n_value) {
        type = EventType::Value;
        eventTime = Clock::getInstance()->getCurrentTime();
        value = n_value;
    }